

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O3

TEXTURE_FORMAT Diligent::BCFormatToUncompressed(TEXTURE_FORMAT Fmt)

{
  if ((ushort)(Fmt - TEX_FORMAT_BC1_TYPELESS) < 0xf) {
    return *(TEXTURE_FORMAT *)(&DAT_0075e028 + (ulong)(ushort)(Fmt - TEX_FORMAT_BC1_TYPELESS) * 2);
  }
  return TEX_FORMAT_UNKNOWN;
}

Assistant:

TEXTURE_FORMAT BCFormatToUncompressed(TEXTURE_FORMAT Fmt)
{
    switch (Fmt)
    {
        // RGB 5:6:5 + 1 bit alpha
        case TEX_FORMAT_BC1_TYPELESS:
            return TEX_FORMAT_RGBA8_TYPELESS;
        case TEX_FORMAT_BC1_UNORM:
            return TEX_FORMAT_RGBA8_UNORM;
        case TEX_FORMAT_BC1_UNORM_SRGB:
            return TEX_FORMAT_RGBA8_UNORM_SRGB;

        // RGB 5:6:5 + 4 bit alpha
        case TEX_FORMAT_BC2_TYPELESS:
            return TEX_FORMAT_RGBA8_TYPELESS;
        case TEX_FORMAT_BC2_UNORM:
            return TEX_FORMAT_RGBA8_UNORM;
        case TEX_FORMAT_BC2_UNORM_SRGB:
            return TEX_FORMAT_RGBA8_UNORM_SRGB;

        // RGB 5:6:5 + 8 bit alpha
        case TEX_FORMAT_BC3_TYPELESS:
            return TEX_FORMAT_RGBA8_TYPELESS;
        case TEX_FORMAT_BC3_UNORM:
            return TEX_FORMAT_RGBA8_UNORM;
        case TEX_FORMAT_BC3_UNORM_SRGB:
            return TEX_FORMAT_RGBA8_UNORM_SRGB;

        // R8
        case TEX_FORMAT_BC4_TYPELESS:
            return TEX_FORMAT_R8_TYPELESS;
        case TEX_FORMAT_BC4_UNORM:
            return TEX_FORMAT_R8_UNORM;
        case TEX_FORMAT_BC4_SNORM:
            return TEX_FORMAT_R8_SNORM;

        // RG 8:8
        case TEX_FORMAT_BC5_TYPELESS:
            return TEX_FORMAT_RG8_TYPELESS;
        case TEX_FORMAT_BC5_UNORM:
            return TEX_FORMAT_RG8_UNORM;
        case TEX_FORMAT_BC5_SNORM:
            return TEX_FORMAT_RG8_SNORM;

        default:
            return TEX_FORMAT_UNKNOWN;
    }
}